

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Container.hpp
# Opt level: O0

void __thiscall
BCL::
Container<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_void>
::set(Container<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_void>
      *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *val,uint64_t rank)

{
  bool bVar1;
  runtime_error *this_00;
  element_type *src;
  size_t extraout_RDX;
  GlobalPtr<char> GVar2;
  serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>
  local_49;
  undefined1 local_48 [8];
  serial_ptr<char> ptr;
  uint64_t rank_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *val_local;
  Container<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_void>
  *this_local;
  
  bVar1 = GlobalPtr<char>::operator!=(&this->ptr,(nullptr_t)0x0);
  if ((bVar1) && (bVar1 = GlobalPtr<char>::is_local(&this->ptr), bVar1)) {
    ptr.N = (this->ptr).rank;
    GVar2.ptr = extraout_RDX;
    GVar2.rank = (this->ptr).ptr;
    dealloc<char>((BCL *)ptr.N,GVar2);
  }
  serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>
  ::operator()((serial_ptr<char> *)local_48,&local_49,val);
  GVar2 = alloc<char>((size_t)ptr.ptr.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi);
  this->ptr = GVar2;
  bVar1 = GlobalPtr<char>::operator==(&this->ptr,(nullptr_t)0x0);
  if (bVar1) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"BCL Container: ran out of memory");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  this->len = (size_t)ptr.ptr.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  ;
  src = std::__shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>::get
                  ((__shared_ptr<char,_(__gnu_cxx::_Lock_policy)2> *)local_48);
  rput<char>(src,this->ptr,
             (size_t)ptr.ptr.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
  ;
  serial_ptr<char>::~serial_ptr((serial_ptr<char> *)local_48);
  return;
}

Assistant:

void set(const T &val, uint64_t rank = BCL::rank()) {
      // TODO: memory leak.
      if (this->ptr != nullptr && this->ptr.is_local()) {
        BCL::dealloc(this->ptr);
      }
      serial_ptr <SPT> ptr = Serialize{}(val);
      this->ptr = BCL::alloc <SPT> (ptr.N);
      if (this->ptr == nullptr) {
        throw std::runtime_error("BCL Container: ran out of memory");
      }
      this->len = ptr.N;
      BCL::rput(ptr.ptr.get(), this->ptr, ptr.N);
    }